

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_log.cpp
# Opt level: O0

void __thiscall cubeb_async_logger::start(cubeb_async_logger *this)

{
  cubeb_async_logger *this_00;
  __pointer_type in_RDI;
  int in_stack_0000000c;
  ring_buffer_base<cubeb_log_message> *in_stack_00000010;
  lock_free_queue<cubeb_log_message> *queue;
  undefined1 in_stack_ffffffffffffffdf;
  cubeb_async_logger *this_01;
  
  this_00 = (cubeb_async_logger *)operator_new(0x18);
  ring_buffer_base<cubeb_log_message>::ring_buffer_base(in_stack_00000010,in_stack_0000000c);
  this_01 = this_00;
  std::atomic<ring_buffer_base<cubeb_log_message>_*>::store
            (&this_00->msg_queue,in_RDI,(memory_order)((ulong)this_00 >> 0x20));
  std::atomic<ring_buffer_base<cubeb_log_message>_*>::store
            (&this_01->msg_queue,in_RDI,(memory_order)((ulong)this_00 >> 0x20));
  std::atomic<bool>::operator=((atomic<bool> *)this_00,(bool)in_stack_ffffffffffffffdf);
  run(this_01);
  return;
}

Assistant:

void start()
  {
    auto * queue =
        new lock_free_queue<cubeb_log_message>(CUBEB_LOG_MESSAGE_QUEUE_DEPTH);
    msg_queue.store(queue);
    msg_queue_consumer.store(queue);
    shutdown_thread = false;
    run();
  }